

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O0

int __thiscall
CVmObjHTTPRequest::getp_setCookie
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t __n;
  vm_httpreq_ext *pvVar4;
  size_t sVar5;
  vm_httpreq_cookie *val;
  int *in_RCX;
  vm_val_t *in_RDX;
  CVmObjHTTPRequest *in_RDI;
  size_t vdomlen;
  size_t vpathlen;
  char *vdom;
  char *vpath;
  vm_httpreq_cookie *cookie;
  size_t cdomlen;
  size_t cpathlen;
  char *cdom;
  char *cpath;
  char *cbuf;
  size_t cval_len;
  size_t cname_len;
  char *cval;
  char *cname;
  uint argc;
  vm_val_t *in_stack_ffffffffffffff28;
  uint *in_stack_ffffffffffffff30;
  vm_val_t *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int n;
  int iVar6;
  vm_httpreq_cookie *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  vm_httpreq_cookie *local_90;
  
  if (in_RCX == (int *)0x0) {
    n = 0;
  }
  else {
    n = *in_RCX;
  }
  iVar6 = n;
  if ((getp_setCookie(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_setCookie(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_setCookie::desc,2);
    __cxa_guard_release(&getp_setCookie(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                     (CVmNativeCodeDesc *)in_stack_ffffffffffffff28);
  if (iVar1 == 0) {
    CVmStack::get(0);
    pcVar2 = vm_val_t::get_as_string(in_stack_ffffffffffffff28);
    CVmStack::get(1);
    pcVar3 = vm_val_t::get_as_string(in_stack_ffffffffffffff28);
    if ((pcVar2 == (char *)0x0) || (pcVar3 == (char *)0x0)) {
      err_throw(0);
    }
    __n = vmb_get_len((char *)0x255ab0);
    vmb_get_len((char *)0x255ac5);
    lib_copy_str((char *)in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30);
    parse_attr_token(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,(char **)in_RDI,
                     (size_t *)CONCAT44(iVar6,in_stack_ffffffffffffff40));
    parse_attr_token(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,(char **)in_RDI,
                     (size_t *)CONCAT44(iVar6,in_stack_ffffffffffffff40));
    pvVar4 = get_ext(in_RDI);
    for (local_90 = pvVar4->cookies; local_90 != (vm_httpreq_cookie *)0x0; local_90 = local_90->nxt)
    {
      sVar5 = strlen(local_90->name);
      if ((sVar5 == __n) && (iVar1 = memcmp(local_90->name,pcVar2 + 2,__n), iVar1 == 0)) {
        parse_attr_token(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,(char **)in_RDI
                         ,(size_t *)CONCAT44(iVar6,in_stack_ffffffffffffff40));
        parse_attr_token(in_stack_ffffffffffffff58,(char *)in_stack_ffffffffffffff50,(char **)in_RDI
                         ,(size_t *)CONCAT44(iVar6,in_stack_ffffffffffffff40));
        iVar1 = match_attrs((char *)in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30,
                            (char *)in_stack_ffffffffffffff28,0x255bf6);
        if ((iVar1 != 0) &&
           (iVar1 = match_attrs((char *)in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30,
                                (char *)in_stack_ffffffffffffff28,0x255c14), iVar1 != 0)) {
          lib_free_str((char *)0x255c29);
          pcVar2 = lib_copy_str((char *)in_stack_ffffffffffffff38,(size_t)in_stack_ffffffffffffff30)
          ;
          local_90->val = pcVar2;
          break;
        }
      }
    }
    lib_free_str((char *)0x255c68);
    if (local_90 == (vm_httpreq_cookie *)0x0) {
      val = (vm_httpreq_cookie *)operator_new(0x18);
      vm_httpreq_cookie::vm_httpreq_cookie
                (in_stack_ffffffffffffff50,(char *)in_RDI,CONCAT44(iVar6,in_stack_ffffffffffffff40),
                 (char *)val,(size_t)in_stack_ffffffffffffff30);
      pvVar4 = get_ext(in_RDI);
      val->nxt = pvVar4->cookies;
      pvVar4 = get_ext(in_RDI);
      pvVar4->cookies = val;
    }
    CVmStack::discard(n);
    vm_val_t::set_nil(in_RDX);
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_setCookie(VMG_ vm_obj_id_t self,
                                      vm_val_t *retval, uint *oargc)
{
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the cookie name and value */
    const char *cname = G_stk->get(0)->get_as_string(vmg0_);
    const char *cval = G_stk->get(1)->get_as_string(vmg0_);

    /* check that we got string values */
    if (cname == 0 || cval == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* get the name and value length and buffer */
    size_t cname_len = vmb_get_len(cname), cval_len = vmb_get_len(cval);
    cname += VMB_LEN;
    cval += VMB_LEN;

    /* get a null-terminated copy of the value, and parse out the 'path' */
    char *cbuf = lib_copy_str(cval, cval_len);
    const char *cpath, *cdom;
    size_t cpathlen, cdomlen;
    parse_attr_token(cbuf, "path", cpath, cpathlen);
    parse_attr_token(cbuf, "domain", cdom, cdomlen);

    /* search for an existing cookie with this name */
    vm_httpreq_cookie *cookie;
    for (cookie = get_ext()->cookies ; cookie != 0 ; cookie = cookie->nxt)
    {
        /* check for a match */
        if (strlen(cookie->name) == cname_len
            && memcmp(cookie->name, cname, cname_len) == 0)
        {
            /* parse the current value's path and domain attributes */
            const char *vpath, *vdom;
            size_t vpathlen, vdomlen;
            parse_attr_token(cookie->val, "path", vpath, vpathlen);
            parse_attr_token(cookie->val, "domain", vdom, vdomlen);

            /*   
             *   Check to see if the path and domain match.  If not, this
             *   counts as a distinct cookie.  
             */
            if (!match_attrs(vpath, vpathlen, cpath, cpathlen)
                || !match_attrs(vdom, vdomlen, cdom, cdomlen))
                continue;

            /* it's already defined - redefine it with the new value */
            lib_free_str(cookie->val);
            cookie->val = lib_copy_str(cval, cval_len);
            break;
        }
    }

    /* done with the allocated value copy */
    lib_free_str(cbuf);

    /* if we didn't replace an existing entry, create a new one */
    if (cookie == 0)
    {
        /* create the entry */
        cookie = new vm_httpreq_cookie(cname, cname_len, cval, cval_len);

        /* link it into our list */
        cookie->nxt = get_ext()->cookies;
        get_ext()->cookies = cookie;
    }

    /* done with the arguments */
    G_stk->discard(argc);

    /* no return value */
    retval->set_nil();

    /* handled */
    return TRUE;
}